

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O1

V3f __thiscall
Imf_3_2::CubeMap::direction(CubeMap *this,CubeMapFace face,Box2i *dataWindow,V2f *positionInFace)

{
  int iVar1;
  int iVar2;
  V3f *dir;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float in_XMM1_Da;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  V3f VVar10;
  
  iVar2 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
  iVar1 = (((dataWindow->max).y - (dataWindow->min).y) + 1) / 6;
  if (iVar2 <= iVar1) {
    iVar1 = iVar2;
  }
  uVar4 = 0;
  if (1 < iVar1) {
    in_XMM1_Da = (float)(iVar1 + -1);
    auVar5._8_8_ = 0;
    auVar5._0_4_ = positionInFace->x;
    auVar5._4_4_ = positionInFace->y;
    auVar6._4_4_ = in_XMM1_Da;
    auVar6._0_4_ = in_XMM1_Da;
    auVar6._8_4_ = in_XMM1_Da;
    auVar6._12_4_ = in_XMM1_Da;
    auVar6 = divps(auVar5,auVar6);
    uVar4 = CONCAT44(auVar6._4_4_ + auVar6._4_4_ + -1.0,auVar6._0_4_ + auVar6._0_4_ + -1.0);
  }
  uVar8 = 0x3f800000;
  *(undefined8 *)this = 0x3f800000;
  *(undefined4 *)(this + 8) = 0;
  uVar3 = (undefined4)uVar4;
  fVar7 = (float)((ulong)uVar4 >> 0x20);
  switch(face) {
  case CUBEFACE_NEG_X:
    uVar8 = 0xbf800000;
  case CUBEFACE_POS_X:
    uVar9 = uVar3;
    break;
  case CUBEFACE_POS_Y:
    uVar9 = 0x3f800000;
    uVar8 = uVar3;
    break;
  case CUBEFACE_NEG_Y:
    uVar9 = 0xbf800000;
    uVar8 = uVar3;
    break;
  case CUBEFACE_POS_Z:
    fVar7 = 1.0;
    goto LAB_001833f9;
  case CUBEFACE_NEG_Z:
    fVar7 = -1.0;
    goto LAB_001833f9;
  default:
    goto switchD_001833c9_default;
  }
  uVar4 = CONCAT44(uVar9,uVar8);
LAB_001833f9:
  *(undefined8 *)this = uVar4;
  *(float *)(this + 8) = fVar7;
  in_XMM1_Da = fVar7;
switchD_001833c9_default:
  VVar10.z = in_XMM1_Da;
  VVar10.x = (float)(int)uVar4;
  VVar10.y = (float)(int)((ulong)uVar4 >> 0x20);
  return VVar10;
}

Assistant:

V3f
direction (CubeMapFace face, const Box2i& dataWindow, const V2f& positionInFace)
{
    int sof = sizeOfFace (dataWindow);

    V2f pos;

    if (sof > 1)
    {
        pos = V2f (
            positionInFace.x / (sof - 1) * 2 - 1,
            positionInFace.y / (sof - 1) * 2 - 1);
    }
    else
    {
        pos = V2f (0, 0);
    }

    V3f dir (1, 0, 0);

    switch (face)
    {
        case CUBEFACE_POS_X:

            dir.x = 1;
            dir.y = pos.x;
            dir.z = pos.y;
            break;

        case CUBEFACE_NEG_X:

            dir.x = -1;
            dir.y = pos.x;
            dir.z = pos.y;
            break;

        case CUBEFACE_POS_Y:

            dir.x = pos.x;
            dir.y = 1;
            dir.z = pos.y;
            break;

        case CUBEFACE_NEG_Y:

            dir.x = pos.x;
            dir.y = -1;
            dir.z = pos.y;
            break;

        case CUBEFACE_POS_Z:

            dir.x = pos.x;
            dir.y = pos.y;
            dir.z = 1;
            break;

        case CUBEFACE_NEG_Z:

            dir.x = pos.x;
            dir.y = pos.y;
            dir.z = -1;
            break;
    }

    return dir;
}